

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::BuildMaterials(ColladaLoader *this,ColladaParser *pParser,aiScene *param_2)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVar2;
  pointer ppVar3;
  pointer ppVar4;
  iterator __position;
  iterator iVar5;
  aiMaterial *this_00;
  _Rb_tree_node_base *p_Var6;
  mapped_type_conflict3 *pmVar7;
  _Base_ptr p_Var8;
  size_t __n;
  Effect *pEVar9;
  bool bVar10;
  aiString name;
  pair<Assimp::Collada::Effect_*,_aiMaterial_*> local_448;
  aiString local_434;
  
  std::
  vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  ::reserve(&this->newMats,
            (pParser->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var8 = (pParser->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pParser->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
              ::find(&(pParser->mEffectLibrary)._M_t,(key_type *)(p_Var8 + 3));
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(pParser->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header) {
        this_00 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_00);
        pEVar9 = (Effect *)(iVar5._M_node + 2);
        bVar10 = p_Var8[2]._M_parent != (_Base_ptr)0x0;
        p_Var6 = p_Var8 + 2;
        if (!bVar10) {
          p_Var6 = p_Var8 + 1;
        }
        __n = (ulong)p_Var6->_M_parent & 0xffffffff;
        if (((ulong)p_Var6->_M_parent & 0xfffffc00) != 0) {
          __n = 0x3ff;
        }
        local_434.length = (ai_uint32)__n;
        memcpy(local_434.data,*(void **)(p_Var8 + (ulong)bVar10 + 1),__n);
        local_434.data[__n] = '\0';
        aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
        ppVar3 = (this->newMats).
                 super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar4 = (this->newMats).
                 super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->mMaterialIndexByName,(key_type *)(p_Var8 + 1));
        *pmVar7 = (long)ppVar3 - (long)ppVar4 >> 4;
        __position._M_current =
             (this->newMats).
             super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_448.first = pEVar9;
        local_448.second = this_00;
        if (__position._M_current ==
            (this->newMats).
            super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<Assimp::Collada::Effect*,aiMaterial*>,std::allocator<std::pair<Assimp::Collada::Effect*,aiMaterial*>>>
          ::_M_realloc_insert<std::pair<Assimp::Collada::Effect*,aiMaterial*>>
                    ((vector<std::pair<Assimp::Collada::Effect*,aiMaterial*>,std::allocator<std::pair<Assimp::Collada::Effect*,aiMaterial*>>>
                      *)&this->newMats,__position,&local_448);
        }
        else {
          (__position._M_current)->first = pEVar9;
          (__position._M_current)->second = this_00;
          pppVar2 = &(this->newMats).
                     super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar2 = *pppVar2 + 1;
        }
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  return;
}

Assistant:

void ColladaLoader::BuildMaterials(ColladaParser& pParser, aiScene* /*pScene*/)
{
    newMats.reserve(pParser.mMaterialLibrary.size());

    for (ColladaParser::MaterialLibrary::const_iterator matIt = pParser.mMaterialLibrary.begin();
        matIt != pParser.mMaterialLibrary.end(); ++matIt) {
        const Collada::Material& material = matIt->second;
        // a material is only a reference to an effect
        ColladaParser::EffectLibrary::iterator effIt = pParser.mEffectLibrary.find(material.mEffect);
        if (effIt == pParser.mEffectLibrary.end())
            continue;
        Collada::Effect& effect = effIt->second;

        // create material
        aiMaterial* mat = new aiMaterial;
        aiString name(material.mName.empty() ? matIt->first : material.mName);
        mat->AddProperty(&name, AI_MATKEY_NAME);

        // store the material
        mMaterialIndexByName[matIt->first] = newMats.size();
        newMats.push_back(std::pair<Collada::Effect*, aiMaterial*>(&effect, mat));
    }
    // ScenePreprocessor generates a default material automatically if none is there.
    // All further code here in this loader works well without a valid material so
    // we can safely let it to ScenePreprocessor.
#if 0
    if (newMats.size() == 0)
    {
        aiMaterial* mat = new aiMaterial;
        aiString name(AI_DEFAULT_MATERIAL_NAME);
        mat->AddProperty(&name, AI_MATKEY_NAME);

        const int shadeMode = aiShadingMode_Phong;
        mat->AddProperty<int>(&shadeMode, 1, AI_MATKEY_SHADING_MODEL);
        aiColor4D colAmbient(0.2, 0.2, 0.2, 1.0), colDiffuse(0.8, 0.8, 0.8, 1.0), colSpecular(0.5, 0.5, 0.5, 0.5);
        mat->AddProperty(&colAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
        mat->AddProperty(&colDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat->AddProperty(&colSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        const ai_real specExp = 5.0;
        mat->AddProperty(&specExp, 1, AI_MATKEY_SHININESS);
}
#endif
}